

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::tessellation_shader
               (NegativeTestContext *ctx)

{
  undefined8 uVar1;
  bool bVar2;
  ProgramSources *pPVar3;
  ProgramSources local_300;
  ShaderSource local_230;
  ShaderSource local_208;
  ShaderSource local_1e0;
  ShaderSource local_1b8;
  undefined1 local_190 [8];
  ProgramSources sources;
  string local_b8;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string tessEvaluation;
  undefined1 local_68 [8];
  string tessControl;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string simpleVtxFrag;
  NegativeTestContext *ctx_local;
  
  simpleVtxFrag.field_2._8_8_ = ctx;
  bVar2 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_CONTROL);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_30,"#version 310 es\nvoid main()\n{\n}\n",&local_31);
    std::allocator<char>::~allocator(&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"#version 310 es\nlayout(vertices = 3) out;\nvoid main()\n{\n}\n",
               (allocator<char> *)(tessEvaluation.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(tessEvaluation.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,
               "#version 310 es\nlayout(triangles, equal_spacing, cw) in;\nvoid main()\n{\n}\n",
               &local_91);
    std::allocator<char>::~allocator(&local_91);
    uVar1 = simpleVtxFrag.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,
               "GL_EXT_tessellation_shader features require enabling the extension in 310 es shaders."
               ,(allocator<char> *)&sources.field_0xcf);
    NegativeTestContext::beginSection((NegativeTestContext *)uVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&sources.field_0xcf);
    glu::ProgramSources::ProgramSources((ProgramSources *)local_190);
    glu::VertexSource::VertexSource((VertexSource *)&local_1b8,(string *)local_30);
    pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)local_190,&local_1b8);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_1e0,(string *)local_68);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_1e0);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_208,(string *)local_90);
    pPVar3 = glu::ProgramSources::operator<<(pPVar3,&local_208);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_230,(string *)local_30);
    glu::ProgramSources::operator<<(pPVar3,&local_230);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_230);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_208);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_1e0);
    glu::VertexSource::~VertexSource((VertexSource *)&local_1b8);
    uVar1 = simpleVtxFrag.field_2._8_8_;
    glu::ProgramSources::ProgramSources(&local_300,(ProgramSources *)local_190);
    verifyProgram((NegativeTestContext *)uVar1,&local_300,EXPECT_RESULT_FAIL);
    glu::ProgramSources::~ProgramSources(&local_300);
    NegativeTestContext::endSection((NegativeTestContext *)simpleVtxFrag.field_2._8_8_);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_190);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void tessellation_shader (NegativeTestContext& ctx)
{
	if (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_CONTROL))
	{
		const std::string	simpleVtxFrag	=	"#version 310 es\n"
												"void main()\n"
												"{\n"
												"}\n";
		const std::string	tessControl		=	"#version 310 es\n"
												"layout(vertices = 3) out;\n"
												"void main()\n"
												"{\n"
												"}\n";
		const std::string	tessEvaluation	=	"#version 310 es\n"
												"layout(triangles, equal_spacing, cw) in;\n"
												"void main()\n"
												"{\n"
												"}\n";
		ctx.beginSection("GL_EXT_tessellation_shader features require enabling the extension in 310 es shaders.");
		glu::ProgramSources sources;
		sources << glu::VertexSource(simpleVtxFrag)
				<< glu::TessellationControlSource(tessControl)
				<< glu::TessellationEvaluationSource(tessEvaluation)
				<< glu::FragmentSource(simpleVtxFrag);
		verifyProgram(ctx, sources, EXPECT_RESULT_FAIL);
		ctx.endSection();
	}
}